

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

int FFSBitfieldTest(FFSMetadataInfoStruct *MBase,int Bit)

{
  size_t *psVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(Bit >> 6);
  if (MBase->BitFieldCount <= uVar2) {
    psVar1 = (size_t *)realloc(MBase->BitField,uVar2 * 8 + 8);
    MBase->BitField = psVar1;
    memset(psVar1 + MBase->BitFieldCount,0,(uVar2 - MBase->BitFieldCount) * 8 + 8);
    MBase->BitFieldCount = uVar2 + 1;
  }
  return (int)((MBase->BitField[uVar2] >> ((ulong)(uint)Bit & 0x3f) & 1) != 0);
}

Assistant:

static int FFSBitfieldTest(struct FFSMetadataInfoStruct *MBase, int Bit)
{
    int Element = Bit / (sizeof(size_t) * 8);
    int ElementBit = Bit % (sizeof(size_t) * 8);
    if (Element >= MBase->BitFieldCount)
    {
        MBase->BitField = realloc(MBase->BitField, sizeof(size_t) * (Element + 1));
        memset(MBase->BitField + MBase->BitFieldCount, 0,
               (Element - MBase->BitFieldCount + 1) * sizeof(size_t));
        MBase->BitFieldCount = Element + 1;
    }
    return ((MBase->BitField[Element] & ((size_t)1 << ElementBit)) == ((size_t)1 << ElementBit));
}